

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<CLI::App_*,_std::allocator<CLI::App_*>_> * __thiscall
CLI::App::get_subcommands
          (vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__return_storage_ptr__,App *this,
          function<bool_(CLI::App_*)> *filter)

{
  pointer psVar1;
  App **ppAVar2;
  pointer psVar3;
  __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> _Var4;
  pointer ppAVar5;
  pointer ppAVar6;
  allocator_type local_19;
  
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            (__return_storage_ptr__,
             (long)(this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_19);
  psVar3 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    ppAVar6 = (__return_storage_ptr__->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    do {
      *ppAVar6 = (psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar3 = psVar3 + 1;
      ppAVar6 = ppAVar6 + 1;
    } while (psVar3 != psVar1);
  }
  if ((filter->super__Function_base)._M_manager != (_Manager_type)0x0) {
    _Var4 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<CLI::App**,std::vector<CLI::App*,std::allocator<CLI::App*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App*)>const&)::_lambda(CLI::App*)_1_>>
                      ((__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                        )(__return_storage_ptr__->
                         super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                        )(__return_storage_ptr__->
                         super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
                         super__Vector_impl_data._M_finish,
                       (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_ThirdParty_helics_external_CLI11_CLI11_hpp:8524:70)>
                        )filter);
    ppAVar2 = (__return_storage_ptr__->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if ((_Var4._M_current != ppAVar2) &&
       (ppAVar6 = (__return_storage_ptr__->
                  super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish,
       ppAVar5 = (pointer)((long)_Var4._M_current + ((long)ppAVar6 - (long)ppAVar2)),
       ppAVar6 != ppAVar5)) {
      (__return_storage_ptr__->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppAVar5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::vector<App *> App::get_subcommands(const std::function<bool(App *)> &filter) {
    std::vector<App *> subcomms(subcommands_.size());
    std::transform(
        std::begin(subcommands_), std::end(subcommands_), std::begin(subcomms), [](const App_p &v) { return v.get(); });

    if(filter) {
        subcomms.erase(
            std::remove_if(std::begin(subcomms), std::end(subcomms), [&filter](App *app) { return !filter(app); }),
            std::end(subcomms));
    }

    return subcomms;
}